

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseFuncflFile
          (EAMAtomTypesSectionParser *this,ForceField *ff,EAMAdapter ea,string *funcflFile,
          int param_5)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  bool bVar1;
  int iVar2;
  ifstrstream *piVar3;
  long *plVar4;
  iterator iVar5;
  iterator iVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  long in_RDI;
  StringTokenizer *this_00;
  RealType RVar8;
  StringTokenizer tokenizer2;
  StringTokenizer tokenizer1;
  vector<double,_std::allocator<double>_> rho;
  vector<double,_std::allocator<double>_> Z;
  vector<double,_std::allocator<double>_> F;
  RealType rcut;
  RealType dr;
  int nr;
  RealType drho;
  int nrho;
  string lattice;
  RealType latticeConstant;
  RealType atomicMass;
  int atomicNumber;
  char buffer [65535];
  int bufferSize;
  ifstrstream *ppfStream;
  _Placeholder<1> *in_stack_fffffffffffefc08;
  StringTokenizer *in_stack_fffffffffffefc10;
  undefined4 in_stack_fffffffffffefc18;
  undefined4 in_stack_fffffffffffefc1c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffefc20;
  vector<double,_std::allocator<double>_> *this_01;
  undefined4 in_stack_fffffffffffefc28;
  undefined4 in_stack_fffffffffffefc2c;
  StringTokenizer *in_stack_fffffffffffefc30;
  string *in_stack_fffffffffffefc40;
  string *in_stack_fffffffffffefc48;
  StringTokenizer *in_stack_fffffffffffefc50;
  errorStruct *in_stack_fffffffffffefc58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffefc60;
  string *in_stack_fffffffffffefcc8;
  ForceField *in_stack_fffffffffffefcd0;
  string asStack_102b8 [32];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffefd70;
  RealType in_stack_fffffffffffefd78;
  RealType in_stack_fffffffffffefd80;
  int nr_00;
  string *in_stack_fffffffffffefda0;
  RealType in_stack_fffffffffffefda8;
  EAMAdapter *in_stack_fffffffffffefdb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffefdc0;
  allocator<char> aStack_10231;
  string asStack_10230 [120];
  string asStack_101b8 [39];
  allocator<char> aStack_10191;
  string asStack_10190 [39];
  allocator<char> aStack_10169;
  string asStack_10168 [208];
  double dStack_10098;
  double dStack_10090;
  int iStack_10084;
  vector<double,_std::allocator<double>_> *pvStack_10080;
  int iStack_10074;
  string asStack_10070 [32];
  double dStack_10050;
  StringTokenizer *pSStack_10048;
  int iStack_1003c;
  undefined1 auStack_10038 [64836];
  int in_stack_fffffffffffffd0c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd10;
  istream *in_stack_fffffffffffffd18;
  EAMAtomTypesSectionParser *in_stack_fffffffffffffd20;
  
  piVar3 = ForceField::openForceFieldFile(in_stack_fffffffffffefcd0,in_stack_fffffffffffefcc8);
  std::istream::getline((char *)piVar3,(long)auStack_10038);
  dStack_10050 = 0.0;
  std::__cxx11::string::string(asStack_10070);
  iStack_10074 = 0;
  pvStack_10080 = (vector<double,_std::allocator<double>_> *)0x0;
  iStack_10084 = 0;
  dStack_10090 = 0.0;
  dStack_10098 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x216821);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x21682e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x21683b);
  plVar4 = (long *)std::istream::getline((char *)piVar3,(long)auStack_10038);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffefc50->tokenString_,(char *)in_stack_fffffffffffefc48,
               (allocator<char> *)in_stack_fffffffffffefc40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffefc50->tokenString_,(char *)in_stack_fffffffffffefc48,
               (allocator<char> *)in_stack_fffffffffffefc40);
    StringTokenizer::StringTokenizer
              (in_stack_fffffffffffefc50,in_stack_fffffffffffefc48,in_stack_fffffffffffefc40);
    std::__cxx11::string::~string(asStack_10190);
    std::allocator<char>::~allocator(&aStack_10191);
    std::__cxx11::string::~string(asStack_10168);
    std::allocator<char>::~allocator(&aStack_10169);
    iVar2 = StringTokenizer::countTokens((StringTokenizer *)in_stack_fffffffffffefc20._M_current);
    if (iVar2 < 4) {
      snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Not enough tokens\n");
      painCave.isFatal = 1;
      simError();
    }
    else {
      iStack_1003c = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffefc30);
      this_00 = (StringTokenizer *)StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffefc50);
      pSStack_10048 = this_00;
      RVar8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffefc50);
      dStack_10050 = RVar8 * *(double *)(in_RDI + 0x38);
      StringTokenizer::nextToken_abi_cxx11_(this_00);
      std::__cxx11::string::operator=(asStack_10070,asStack_101b8);
      std::__cxx11::string::~string(asStack_101b8);
    }
    StringTokenizer::~StringTokenizer(in_stack_fffffffffffefc10);
  }
  plVar4 = (long *)std::istream::getline((char *)piVar3,(long)auStack_10038);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffefc50->tokenString_,(char *)in_stack_fffffffffffefc48,
               (allocator<char> *)in_stack_fffffffffffefc40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffefc50->tokenString_,(char *)in_stack_fffffffffffefc48,
               (allocator<char> *)in_stack_fffffffffffefc40);
    StringTokenizer::StringTokenizer
              (in_stack_fffffffffffefc50,in_stack_fffffffffffefc48,in_stack_fffffffffffefc40);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffefda8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffefda7);
    std::__cxx11::string::~string(asStack_10230);
    std::allocator<char>::~allocator(&aStack_10231);
    iVar2 = StringTokenizer::countTokens((StringTokenizer *)in_stack_fffffffffffefc20._M_current);
    if (iVar2 < 5) {
      in_stack_fffffffffffefc58 = &painCave;
      snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Not enough tokens\n");
      in_stack_fffffffffffefc58->isFatal = 1;
      simError();
    }
    else {
      iStack_10074 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffefc30);
      pvStack_10080 =
           (vector<double,_std::allocator<double>_> *)
           StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffefc50);
      iStack_10084 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffefc30);
      RVar8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffefc50);
      dStack_10090 = RVar8 * *(double *)(in_RDI + 0x38);
      in_stack_fffffffffffefc60 =
           (vector<double,_std::allocator<double>_> *)
           StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffefc50);
      dStack_10098 = (double)in_stack_fffffffffffefc60 * *(double *)(in_RDI + 0x38);
    }
    StringTokenizer::~StringTokenizer(in_stack_fffffffffffefc10);
  }
  parseEAMArray(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                in_stack_fffffffffffffd0c);
  parseEAMArray(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                in_stack_fffffffffffffd0c);
  parseEAMArray(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                in_stack_fffffffffffffd0c);
  iVar5 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffefc08);
  iVar2 = (int)((ulong)iVar5._M_current >> 0x20);
  iVar5 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffefc08);
  iVar6 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffefc08);
  nr_00 = (int)((ulong)iVar6._M_current >> 0x20);
  std::bind<std::multiplies<double>,double&,std::_Placeholder<1>const&>
            ((multiplies<double> *)CONCAT44(in_stack_fffffffffffefc1c,in_stack_fffffffffffefc18),
             (double *)in_stack_fffffffffffefc10,in_stack_fffffffffffefc08);
  __first._M_current._4_4_ = in_stack_fffffffffffefc2c;
  __first._M_current._0_4_ = in_stack_fffffffffffefc28;
  _Var7._M_current._4_4_ = in_stack_fffffffffffefc1c;
  _Var7._M_current._0_4_ = in_stack_fffffffffffefc18;
  _Var7 = std::
          transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::_Bind<std::multiplies<double>(double,std::_Placeholder<1>)>>
                    (__first,in_stack_fffffffffffefc20,_Var7,
                     (_Bind<std::multiplies<double>_(double,_std::_Placeholder<1>)> *)
                     in_stack_fffffffffffefc10);
  std::__cxx11::string::string(asStack_102b8,asStack_10070);
  this_01 = pvStack_10080;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffefc60,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffefc58);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffefc60,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffefc58);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffefc60,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffefc58);
  EAMAdapter::makeFuncfl
            (in_stack_fffffffffffefdb0,in_stack_fffffffffffefda8,in_stack_fffffffffffefda0,iVar2,
             (RealType)iVar5._M_current,nr_00,in_stack_fffffffffffefd80,in_stack_fffffffffffefd78,
             in_stack_fffffffffffefd70,(vector<double,_std::allocator<double>_> *)_Var7._M_current,
             in_stack_fffffffffffefdc0);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::__cxx11::string::~string(asStack_102b8);
  if (piVar3 != (ifstrstream *)0x0) {
    (*(piVar3->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[1])();
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::__cxx11::string::~string(asStack_10070);
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseFuncflFile(ForceField& ff, EAMAdapter ea,
                                                  const string& funcflFile,
                                                  int) {
    ifstrstream* ppfStream = ff.openForceFieldFile(funcflFile);
    const int bufferSize   = 65535;
    char buffer[bufferSize];

    // skip first line
    ppfStream->getline(buffer, bufferSize);

    // The second line contains atomic number, atomic mass, a lattice
    // constant and lattice type
    int atomicNumber;
    RealType atomicMass;
    RealType latticeConstant(0.0);
    std::string lattice;

    // The third line is nrho, drho, nr, dr and rcut
    int nrho(0);
    RealType drho(0.0);
    int nr(0);
    RealType dr(0.0);
    RealType rcut(0.0);
    std::vector<RealType> F;
    std::vector<RealType> Z;
    std::vector<RealType> rho;

    if (ppfStream->getline(buffer, bufferSize)) {
      StringTokenizer tokenizer1(buffer);

      if (tokenizer1.countTokens() >= 4) {
        atomicNumber    = tokenizer1.nextTokenAsInt();
        atomicMass      = tokenizer1.nextTokenAsDouble();
        latticeConstant = tokenizer1.nextTokenAsDouble() * dus_;
        lattice         = tokenizer1.nextToken();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    FIX_UNUSED(atomicNumber);
    FIX_UNUSED(atomicMass);

    if (ppfStream->getline(buffer, bufferSize)) {
      StringTokenizer tokenizer2(buffer);

      if (tokenizer2.countTokens() >= 5) {
        nrho = tokenizer2.nextTokenAsInt();
        drho = tokenizer2.nextTokenAsDouble();
        nr   = tokenizer2.nextTokenAsInt();
        dr   = tokenizer2.nextTokenAsDouble() * dus_;
        rcut = tokenizer2.nextTokenAsDouble() * dus_;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    parseEAMArray(*ppfStream, F, nrho);
    parseEAMArray(*ppfStream, Z, nr);
    parseEAMArray(*ppfStream, rho, nr);

    // Convert to kcal/mol using energy unit scaling in force field:
    std::transform(
        F.begin(), F.end(), F.begin(),
        std::bind(std::multiplies<RealType>(), eus_, std::placeholders::_1));

    ea.makeFuncfl(latticeConstant, lattice, nrho, drho, nr, dr, rcut, Z, rho,
                  F);

    delete ppfStream;
  }